

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder_test.cpp
# Opt level: O2

void __thiscall forwarder::forwarder(forwarder *this,forwarder *param_1)

{
  std::__shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<cppcms::service,_(__gnu_cxx::_Lock_policy)2> *)param_1);
  booster::intrusive_ptr<cppcms::application>::intrusive_ptr(&this->app_,&param_1->app_);
  return;
}

Assistant:

forwarder(bool internal)
	{
		cppcms::json::value settings;
		settings["service"]["api"]="http";
		settings["service"]["port"]=8080;
		settings["service"]["disable_global_exit_handling"]=true;
		settings["http"]["script_names"][0]="/test";
		if(internal) {
			settings["forwarding"]["rules"][0]["ip"]="127.0.0.1";
			settings["forwarding"]["rules"][0]["port"]=8081;
		}
		srv.reset(new cppcms::service(settings));

		if(!internal) {
			std::cout << "Tesing application level forwarding" << std::endl;
			app_=new mini_forwarder(*srv);
			srv->applications_pool().mount(app_);
		}
		else {
			std::cout << "Tesing internal forwarder" << std::endl;
			TEST(srv->forwarder().check_forwading_rules("127.0.0.1:8080","/test","").second==8081);
		}

	}